

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

ByteData * __thiscall
cfd::ConfidentialTransactionContext::CreateSignatureHash
          (ByteData *__return_storage_ptr__,ConfidentialTransactionContext *this,OutPoint *outpoint,
          Pubkey *pubkey,SigHashType *sighash_type,ConfidentialValue *value,WitnessVersion version)

{
  uint32_t txin_index;
  ByteData256 sighash;
  Script script;
  ByteData local_a8;
  ByteData256 local_90;
  SigHashType local_74;
  Script local_68;
  
  core::ScriptUtil::CreateP2pkhLockingScript(&local_68,pubkey);
  txin_index = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
                 _vptr_AbstractTransaction[0xf])(this,outpoint);
  core::Script::GetData(&local_a8,&local_68);
  core::SigHashType::SigHashType(&local_74,sighash_type);
  core::ConfidentialTransaction::GetElementsSignatureHash
            (&local_90,&this->super_ConfidentialTransaction,txin_index,&local_a8,&local_74,value,
             version);
  if (local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  core::ByteData256::GetBytes(&local_a8.data_,&local_90);
  core::ByteData::ByteData(__return_storage_ptr__,&local_a8.data_);
  if (local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  core::Script::~Script(&local_68);
  return __return_storage_ptr__;
}

Assistant:

ByteData ConfidentialTransactionContext::CreateSignatureHash(
    const OutPoint& outpoint, const Pubkey& pubkey, SigHashType sighash_type,
    const ConfidentialValue& value, WitnessVersion version) const {
  Script script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  ByteData256 sighash = GetElementsSignatureHash(
      GetTxInIndex(outpoint), script.GetData(), sighash_type, value, version);
  return ByteData(sighash.GetBytes());
}